

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void __thiscall ChunkedStackPool<4092>::Reset(ChunkedStackPool<4092> *this)

{
  StackChunk *pSVar1;
  StackChunk *next;
  ChunkedStackPool<4092> *this_local;
  
  while (this->first != (StackChunk *)0x0) {
    pSVar1 = this->first->next;
    (*(code *)NULLC::dealloc)(this->first);
    this->first = pSVar1;
  }
  this->first = (StackChunk *)0x0;
  this->curr = (StackChunk *)0x0;
  this->size = 0xffc;
  return;
}

Assistant:

void Reset()
	{
		while(first)
		{
			StackChunk *next = first->next;
			NULLC::dealloc(first);
			first = next;
		}
		curr = first = NULL;
		size = chunkSize;
	}